

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_GLYPH(effect_handler_context_t_conflict *context)

{
  loc grid;
  loc grid_00;
  loc grid_01;
  _Bool _Var1;
  loc lVar2;
  object *poVar3;
  char *fmt;
  
  lVar2 = cave_find_decoy(cave);
  context->ident = true;
  _Var1 = loc_is_zero((loc_conflict)lVar2);
  if ((_Var1) || (context->subtype != 2)) {
    lVar2.x = (player->grid).x;
    lVar2.y = (player->grid).y;
    _Var1 = square_istrappable(cave,lVar2);
    if (_Var1) {
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      poVar3 = square_object(cave,grid);
      if (poVar3 != (object *)0x0) {
        grid_00.x = (player->grid).x;
        grid_00.y = (player->grid).y;
        push_object(grid_00);
      }
      grid_01.x = (player->grid).x;
      grid_01.y = (player->grid).y;
      square_add_glyph(cave,grid_01,context->subtype);
      return true;
    }
    fmt = "There is no clear floor on which to cast the spell.";
  }
  else {
    fmt = "You can only deploy one decoy at a time.";
  }
  msg(fmt);
  return false;
}

Assistant:

bool effect_handler_GLYPH(effect_handler_context_t *context)
{
	struct loc decoy = cave_find_decoy(cave);

	/* Always notice */
	context->ident = true;

	/* Only one decoy at a time */
	if (!loc_is_zero(decoy) && (context->subtype == GLYPH_DECOY)) {
		msg("You can only deploy one decoy at a time.");
		return false;
	}

	/* See if the effect works */
	if (!square_istrappable(cave, player->grid)) {
		msg("There is no clear floor on which to cast the spell.");
		return false;
	}

	/* Push objects off the grid */
	if (square_object(cave, player->grid))
		push_object(player->grid);

	/* Create a glyph */
	square_add_glyph(cave, player->grid, context->subtype);

	return true;
}